

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugLine::ParsingState::appendRowToMatrix(ParsingState *this)

{
  Sequence *this_00;
  LineTable *pLVar1;
  uint64_t uVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  
  pLVar1 = this->LineTable;
  uVar5 = (uint)((ulong)((long)(pLVar1->Rows).
                               super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pLVar1->Rows).
                              super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if ((this->Sequence).Empty == true) {
    (this->Sequence).Empty = false;
    (this->Sequence).LowPC = (this->Row).Address.Address;
    (this->Sequence).FirstRowIndex = uVar5;
  }
  std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::push_back
            (&pLVar1->Rows,&this->Row);
  bVar4 = (this->Row).field_0x1d;
  if ((bVar4 & 4) != 0) {
    this_00 = &this->Sequence;
    (this->Sequence).LastRowIndex = uVar5 + 1;
    uVar2 = (this->Row).Address.SectionIndex;
    (this->Sequence).HighPC = (this->Row).Address.Address;
    (this->Sequence).SectionIndex = uVar2;
    bVar3 = Sequence::isValid(this_00);
    if (bVar3) {
      std::vector<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>::
      push_back(&this->LineTable->Sequences,this_00);
    }
    this_00->LowPC = 0;
    (this->Sequence).HighPC = 0;
    (this->Sequence).SectionIndex = 0xffffffffffffffff;
    (this->Sequence).FirstRowIndex = 0;
    (this->Sequence).LastRowIndex = 0;
    (this->Sequence).Empty = true;
    bVar4 = (this->Row).field_0x1d;
  }
  (this->Row).Discriminator = 0;
  (this->Row).field_0x1d = bVar4 & 0xe5;
  return;
}

Assistant:

void DWARFDebugLine::ParsingState::appendRowToMatrix() {
  unsigned RowNumber = LineTable->Rows.size();
  if (Sequence.Empty) {
    // Record the beginning of instruction sequence.
    Sequence.Empty = false;
    Sequence.LowPC = Row.Address.Address;
    Sequence.FirstRowIndex = RowNumber;
  }
  LineTable->appendRow(Row);
  if (Row.EndSequence) {
    // Record the end of instruction sequence.
    Sequence.HighPC = Row.Address.Address;
    Sequence.LastRowIndex = RowNumber + 1;
    Sequence.SectionIndex = Row.Address.SectionIndex;
    if (Sequence.isValid())
      LineTable->appendSequence(Sequence);
    Sequence.reset();
  }
  Row.postAppend();
}